

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2RenderUtil.cpp
# Opt level: O2

void deqp::egl::gles2::readPixels(Functions *gl,Surface *dst,int x,int y,int width,int height)

{
  glReadPixelsFunc p_Var1;
  PixelBufferAccess local_58;
  
  tcu::Surface::setSize(dst,width,height);
  p_Var1 = gl->readPixels;
  tcu::Surface::getAccess(&local_58,dst);
  (*p_Var1)(x,y,width,height,0x1908,0x1401,local_58.super_ConstPixelBufferAccess.m_data);
  return;
}

Assistant:

void readPixels (const glw::Functions& gl, tcu::Surface& dst, int x, int y, int width, int height)
{
	dst.setSize(width, height);
	gl.readPixels(x, y, width, height, GL_RGBA, GL_UNSIGNED_BYTE, dst.getAccess().getDataPtr());
}